

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(cmGeneratorExpressionDAGChecker *this)

{
  bool bVar1;
  string_view str;
  string_view str_00;
  
  str._M_str = (this->Property)._M_dataplus._M_p;
  str._M_len = (this->Property)._M_string_length;
  bVar1 = cmHasLiteralPrefix<19ul>(str,(char (*) [19])"TARGET_GENEX_EVAL:");
  if (bVar1) {
    return true;
  }
  str_00._M_str = (this->Property)._M_dataplus._M_p;
  str_00._M_len = (this->Property)._M_string_length;
  bVar1 = cmHasLiteralPrefix<12ul>(str_00,(char (*) [12])0x760e3a);
  return bVar1;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression() const
{
  return cmHasLiteralPrefix(this->Property, "TARGET_GENEX_EVAL:") ||
    cmHasLiteralPrefix(this->Property, "GENEX_EVAL:");
}